

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

Value * __thiscall
anon_unknown.dwarf_1c63ff3::Target::Dump(Value *__return_storage_ptr__,Target *this)

{
  ValueHolder *__x;
  _Link_type __k;
  size_type *psVar1;
  size_t *psVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  cmInstallTargetGenerator *this_00;
  void *pvVar5;
  pointer pSVar6;
  pointer pSVar7;
  size_type sVar8;
  long *plVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  ValueHolder VVar13;
  ValueHolder VVar14;
  ValueHolder VVar15;
  ValueHolder VVar16;
  ValueHolder VVar17;
  undefined8 uVar18;
  const_iterator cVar19;
  bool bVar20;
  TargetType TVar21;
  JBTIndex JVar23;
  ArrayIndex si;
  JBTIndex *__cur;
  int iVar22;
  string *psVar24;
  Value *pVVar25;
  cmLocalGenerator *pcVar26;
  string *psVar27;
  vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> *__x_00;
  OutputInfo *pOVar28;
  undefined8 *puVar29;
  cmValue cVar30;
  cmGlobalGenerator *this_01;
  TargetDependSet *pTVar31;
  _Base_ptr p_Var32;
  iterator iVar33;
  _Rb_tree_node_base *this_02;
  _Rb_tree_node_base *p_Var34;
  iterator iVar35;
  byte extraout_var;
  undefined8 uVar36;
  pointer pIVar37;
  pointer pIVar38;
  ulong uVar39;
  pointer pJVar40;
  ValueHolder *pVVar41;
  KindedSources *pKVar42;
  pointer pJVar43;
  pointer pJVar44;
  pointer __result;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar45;
  Value *extraout_RAX;
  ulong uVar46;
  __normal_iterator<const_(anonymous_namespace)::CompileData::IncludeEntry_*,_std::vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>_>
  __last;
  long lVar47;
  ArrayIndex extraout_EDX;
  ArrayIndex extraout_EDX_00;
  JBTIndex bt;
  JBTIndex bt_00;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  size_t __n;
  __normal_iterator<const_(anonymous_namespace)::CompileData::IncludeEntry_*,_std::vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>_>
  __first;
  string *extraout_RDX_03;
  string *extraout_RDX_04;
  _Rb_tree_header *p_Var48;
  pointer pJVar49;
  pointer sk;
  pointer value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar50;
  _Link_type __p;
  ValueHolder VVar51;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar52;
  size_t __n_00;
  _Base_ptr p_Var53;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *l;
  ValueHolder VVar54;
  pointer pJVar55;
  pointer pJVar56;
  pointer pJVar57;
  BacktraceData *pBVar58;
  _Base_ptr p_Var59;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar60;
  IncludeEntry *i;
  ValueHolder VVar61;
  ValueHolder *pVVar62;
  _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
  *this_03;
  ulong uVar63;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar64;
  Target *this_04;
  pointer pJVar65;
  _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  *p_Var66;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar67;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  defines;
  string obj_dir;
  string p;
  size_type __dnew;
  Value artifact;
  Value dependencies;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  Value compileGroups;
  Value sourceGroups;
  pointer local_2a8;
  ValueHolder local_290;
  ValueHolder local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_280;
  size_type local_268;
  ValueHolder local_260;
  ValueHolder local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  JBTIndex local_240;
  ValueHolder local_238;
  ValueHolder local_230;
  ValueHolder local_228;
  ValueHolder *local_220;
  ValueHolder *local_218;
  undefined8 local_210;
  ValueHolder local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  ValueHolder local_1e0;
  ValueHolder local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  undefined1 local_1c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  pointer local_170;
  vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_168;
  undefined1 local_150 [24];
  pointer pJStack_138;
  pointer local_130;
  __node_base _Stack_128;
  pointer local_120;
  const_iterator cStack_118;
  pointer local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  _Base_ptr local_100;
  _Base_ptr local_f8;
  ValueHolder local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  ValueHolder local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [2];
  BacktraceData *local_98;
  ValueHolder local_90;
  ValueHolder *local_88;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  TVar21 = cmGeneratorTarget::GetType(this->GT);
  paVar50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(ulong)TVar21;
  psVar24 = cmGeneratorTarget::GetName_abi_cxx11_(this->GT);
  Json::Value::Value((Value *)&local_1e0,psVar24);
  pVVar25 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar25,(Value *)&local_1e0);
  Json::Value::~Value((Value *)&local_1e0);
  psVar24 = cmState::GetTargetTypeName_abi_cxx11_(TVar21);
  Json::Value::Value((Value *)&local_1e0,psVar24);
  pVVar25 = Json::Value::operator[](__return_storage_ptr__,"type");
  Json::Value::operator=(pVVar25,(Value *)&local_1e0);
  Json::Value::~Value((Value *)&local_1e0);
  psVar24 = &this->TopBuild;
  TargetId((string *)&local_290,this->GT,psVar24);
  Json::Value::Value((Value *)&local_1e0,(String *)&local_290);
  pVVar25 = Json::Value::operator[](__return_storage_ptr__,"id");
  Json::Value::operator=(pVVar25,(Value *)&local_1e0);
  Json::Value::~Value((Value *)&local_1e0);
  if (local_290 != &aStack_280) {
    operator_delete(local_290.string_,(ulong)(aStack_280._M_allocated_capacity + 1));
  }
  Json::Value::Value((Value *)&local_290,objectValue);
  pcVar26 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  psVar27 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(pcVar26);
  cmSystemTools::RelativeIfUnder((string *)&local_238,&this->TopSource,psVar27);
  Json::Value::Value((Value *)&local_1e0,(String *)&local_238);
  pVVar25 = Json::Value::operator[]((Value *)&local_290,"source");
  Json::Value::operator=(pVVar25,(Value *)&local_1e0);
  Json::Value::~Value((Value *)&local_1e0);
  if (local_238 != &local_228) {
    operator_delete(local_238.string_,local_228.int_ + 1);
  }
  psVar27 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar26);
  cmSystemTools::RelativeIfUnder((string *)&local_238,psVar24,psVar27);
  Json::Value::Value((Value *)&local_1e0,(String *)&local_238);
  pVVar25 = Json::Value::operator[]((Value *)&local_290,"build");
  Json::Value::operator=(pVVar25,(Value *)&local_1e0);
  Json::Value::~Value((Value *)&local_1e0);
  if (local_238 != &local_228) {
    operator_delete(local_238.string_,local_228.int_ + 1);
  }
  pVVar25 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar25,(Value *)&local_290);
  Json::Value::~Value((Value *)&local_290);
  bVar20 = cmTarget::GetIsGeneratorProvided(this->GT->Target);
  if (bVar20) {
    Json::Value::Value((Value *)&local_1e0,true);
    pVVar25 = Json::Value::operator[](__return_storage_ptr__,"isGeneratorProvided");
    Json::Value::operator=(pVVar25,(Value *)&local_1e0);
    Json::Value::~Value((Value *)&local_1e0);
  }
  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&local_1e0);
  AddBacktrace(this,__return_storage_ptr__,(cmListFileBacktrace *)&local_1e0);
  if (local_1d8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8.map_);
  }
  bVar20 = cmTarget::GetHaveInstallRule(this->GT->Target);
  if (bVar20) {
    Json::Value::Value((Value *)&local_260,objectValue);
    Json::Value::Value((Value *)&local_290,objectValue);
    pcVar3 = this->GT->Makefile;
    local_208.int_ = (LargestInt)&DAT_00000014;
    local_1e0.string_ = (char *)&local_1d0;
    local_1e0.int_ = std::__cxx11::string::_M_create(&local_1e0.uint_,(ulong)&local_208);
    local_1d0._M_allocated_capacity._0_4_ = (undefined4)local_208.int_;
    local_1d0._M_local_buf[4] = (char)((ulong)local_208 >> 0x20);
    local_1d0._M_local_buf[5] = (char)((ulong)local_208 >> 0x28);
    local_1d0._M_local_buf[6] = (char)((ulong)local_208 >> 0x30);
    local_1d0._M_local_buf[7] = (char)((ulong)local_208 >> 0x38);
    builtin_strncpy((char *)local_1e0,"CMAKE_IN",8);
    *(undefined8 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(local_1e0.map_)->_M_t)->_M_local_buf + 8) = 0x52505f4c4c415453;
    *(undefined4 *)
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&(local_1e0.map_)->_M_t + 1) = 0x58494645;
    local_1d8.int_ = local_208.int_;
    local_1e0.string_[local_208.string_] = '\0';
    psVar27 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&local_1e0);
    local_238.string_ = (char *)&local_228;
    pcVar4 = (psVar27->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,pcVar4,pcVar4 + psVar27->_M_string_length);
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0.string_,
                      CONCAT17(local_1d0._M_local_buf[7],
                               CONCAT16(local_1d0._M_local_buf[6],
                                        CONCAT15(local_1d0._M_local_buf[5],
                                                 CONCAT14(local_1d0._M_local_buf[4],
                                                          local_1d0._M_allocated_capacity._0_4_))))
                      + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&local_238);
    Json::Value::Value((Value *)&local_1e0,(String *)&local_238);
    pVVar25 = Json::Value::operator[]((Value *)&local_290,"path");
    Json::Value::operator=(pVVar25,(Value *)&local_1e0);
    Json::Value::~Value((Value *)&local_1e0);
    if (local_238 != &local_228) {
      operator_delete(local_238.string_,local_228.int_ + 1);
    }
    pVVar25 = Json::Value::operator[]((Value *)&local_260,"prefix");
    Json::Value::operator=(pVVar25,(Value *)&local_290);
    Json::Value::~Value((Value *)&local_290);
    Json::Value::Value((Value *)&local_238,arrayValue);
    local_108 = paVar50;
    __x_00 = cmTarget::GetInstallGenerators(this->GT->Target);
    std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::vector
              ((vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> *)
               &local_f0,__x_00);
    paVar50 = local_e8;
    if (local_f0 != local_e8) {
      VVar54 = local_f0;
      do {
        this_00 = *(cmInstallTargetGenerator **)VVar54.string_;
        Json::Value::Value((Value *)&local_290,objectValue);
        cmInstallTargetGenerator::GetDestination((string *)&local_208,this_00,this->Config);
        Json::Value::Value((Value *)&local_1e0,(String *)&local_208);
        pVVar25 = Json::Value::operator[]((Value *)&local_290,"path");
        Json::Value::operator=(pVVar25,(Value *)&local_1e0);
        Json::Value::~Value((Value *)&local_1e0);
        if (local_208 != &local_1f8) {
          operator_delete(local_208.string_,local_1f8._M_allocated_capacity + 1);
        }
        AddBacktrace(this,(Value *)&local_290,&(this_00->super_cmInstallGenerator).Backtrace);
        Json::Value::append((Value *)&local_238,(Value *)&local_290);
        Json::Value::~Value((Value *)&local_290);
        VVar54.string_ =
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(VVar54.map_)->_M_t)->_M_local_buf + 8;
      } while (VVar54 != paVar50);
    }
    paVar50 = local_108;
    if (local_f0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_f0.string_,local_e0._M_allocated_capacity - (long)local_f0);
    }
    pVVar25 = Json::Value::operator[]((Value *)&local_260,"destinations");
    Json::Value::operator=(pVVar25,(Value *)&local_238);
    Json::Value::~Value((Value *)&local_238);
    pVVar25 = Json::Value::operator[](__return_storage_ptr__,"install");
    Json::Value::operator=(pVVar25,(Value *)&local_260);
    Json::Value::~Value((Value *)&local_260);
  }
  bVar20 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar20) {
    Json::Value::Value((Value *)&local_238,arrayValue);
    TVar21 = cmGeneratorTarget::GetType(this->GT);
    if (TVar21 == OBJECT_LIBRARY) {
      bVar20 = cmTarget::HasKnownObjectFileLocation(this->GT->Target,(string *)0x0);
      if (bVar20) {
        local_c8.int_ = 0;
        paStack_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
        local_b8[0]._M_allocated_capacity = (char *)0x0;
        cmGeneratorTarget::GetObjectSources
                  (this->GT,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                            &local_c8,this->Config);
        local_108 = paVar50;
        cmGeneratorTarget::GetObjectDirectory((string *)&local_260,this->GT,this->Config);
        paVar50 = paStack_c0;
        if (local_c8 != paStack_c0) {
          VVar54 = local_c8;
          do {
            psVar27 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                                (this->GT,*(cmSourceFile **)VVar54.string_);
            Json::Value::Value((Value *)&local_1e0,objectValue);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_260,psVar27);
            cmSystemTools::RelativeIfUnder((string *)&local_208,psVar24,(string *)&local_f0);
            Json::Value::Value((Value *)&local_290,(String *)&local_208);
            pVVar25 = Json::Value::operator[]((Value *)&local_1e0,"path");
            Json::Value::operator=(pVVar25,(Value *)&local_290);
            Json::Value::~Value((Value *)&local_290);
            if (local_208 != &local_1f8) {
              operator_delete(local_208.string_,local_1f8._M_allocated_capacity + 1);
            }
            if (local_f0 != &local_e0) {
              operator_delete(local_f0.string_,(ulong)(local_e0._M_allocated_capacity + 1));
            }
            Json::Value::append((Value *)&local_238,(Value *)&local_1e0);
            Json::Value::~Value((Value *)&local_1e0);
            VVar54.string_ =
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(VVar54.map_)->_M_t)->_M_local_buf + 8;
          } while (VVar54 != paVar50);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260.string_,
                          CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0])
                          + 1);
        }
        paVar50 = local_108;
        if (local_c8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_c8.string_,local_b8[0]._M_allocated_capacity - (long)local_c8);
        }
      }
    }
    else {
      Json::Value::Value((Value *)&local_1e0,objectValue);
      cmGeneratorTarget::GetFullPath
                ((string *)&local_208,this->GT,this->Config,RuntimeBinaryArtifact,false);
      cmSystemTools::RelativeIfUnder((string *)&local_260,psVar24,(string *)&local_208);
      Json::Value::Value((Value *)&local_290,(String *)&local_260);
      pVVar25 = Json::Value::operator[]((Value *)&local_1e0,"path");
      Json::Value::operator=(pVVar25,(Value *)&local_290);
      Json::Value::~Value((Value *)&local_290);
      if (local_260 != &local_250) {
        operator_delete(local_260.string_,
                        CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]) +
                        1);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208.string_,local_1f8._M_allocated_capacity + 1);
      }
      Json::Value::append((Value *)&local_238,(Value *)&local_1e0);
      Json::Value::~Value((Value *)&local_1e0);
      bVar20 = cmGeneratorTarget::HasImportLibrary(this->GT,this->Config);
      if (bVar20) {
        Json::Value::Value((Value *)&local_1e0,objectValue);
        cmGeneratorTarget::GetFullPath
                  ((string *)&local_208,this->GT,this->Config,ImportLibraryArtifact,false);
        cmSystemTools::RelativeIfUnder((string *)&local_260,psVar24,(string *)&local_208);
        Json::Value::Value((Value *)&local_290,(String *)&local_260);
        pVVar25 = Json::Value::operator[]((Value *)&local_1e0,"path");
        Json::Value::operator=(pVVar25,(Value *)&local_290);
        Json::Value::~Value((Value *)&local_290);
        if (local_260 != &local_250) {
          operator_delete(local_260.string_,
                          CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0])
                          + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208.string_,local_1f8._M_allocated_capacity + 1);
        }
        Json::Value::append((Value *)&local_238,(Value *)&local_1e0);
        Json::Value::~Value((Value *)&local_1e0);
      }
      bVar20 = cmGeneratorTarget::IsDLLPlatform(this->GT);
      if ((((bVar20) && (TVar21 = cmGeneratorTarget::GetType(this->GT), TVar21 != STATIC_LIBRARY))
          && (pOVar28 = cmGeneratorTarget::GetOutputInfo(this->GT,this->Config),
             pOVar28 != (OutputInfo *)0x0)) && ((pOVar28->PdbDir)._M_string_length != 0)) {
        Json::Value::Value((Value *)&local_1e0,objectValue);
        pcVar4 = (pOVar28->PdbDir)._M_dataplus._M_p;
        local_f0.string_ = (char *)&local_e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,pcVar4,pcVar4 + (pOVar28->PdbDir)._M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)&local_f0,(ulong)local_e8,0,'\x01');
        cmGeneratorTarget::GetPDBName((string *)&local_c8,this->GT,this->Config);
        uVar36 = (char *)0xf;
        if (local_f0 != &local_e0) {
          uVar36 = local_e0._M_allocated_capacity;
        }
        if ((ulong)uVar36 < local_e8->_M_local_buf + (long)paStack_c0->_M_local_buf) {
          uVar36 = (char *)0xf;
          if (local_c8 != local_b8) {
            uVar36 = local_b8[0]._M_allocated_capacity;
          }
          if ((ulong)uVar36 < local_e8->_M_local_buf + (long)paStack_c0->_M_local_buf)
          goto LAB_00476f86;
          puVar29 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,local_f0.uint_);
        }
        else {
LAB_00476f86:
          puVar29 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_f0.int_,local_c8.uint_);
        }
        paVar52 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar29 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar29 == paVar52) {
          local_1f8._M_allocated_capacity = paVar52->_M_allocated_capacity;
          local_1f8._8_8_ = puVar29[3];
          local_208.string_ = (char *)&local_1f8;
        }
        else {
          local_1f8._M_allocated_capacity = paVar52->_M_allocated_capacity;
          local_208.string_ = ((char *)*puVar29).string_;
        }
        local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar29[1];
        *puVar29 = paVar52;
        puVar29[1] = 0;
        paVar52->_M_local_buf[0] = '\0';
        cmSystemTools::RelativeIfUnder((string *)&local_260,psVar24,(string *)&local_208);
        Json::Value::Value((Value *)&local_290,(String *)&local_260);
        pVVar25 = Json::Value::operator[]((Value *)&local_1e0,"path");
        Json::Value::operator=(pVVar25,(Value *)&local_290);
        Json::Value::~Value((Value *)&local_290);
        if (local_260 != &local_250) {
          operator_delete(local_260.string_,
                          CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0])
                          + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208.string_,local_1f8._M_allocated_capacity + 1);
        }
        if (local_c8 != local_b8) {
          operator_delete(local_c8.string_,(ulong)(local_b8[0]._M_allocated_capacity + 1));
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0.string_,(ulong)(local_e0._M_allocated_capacity + 1));
        }
        Json::Value::append((Value *)&local_238,(Value *)&local_1e0);
        Json::Value::~Value((Value *)&local_1e0);
      }
    }
    bVar20 = Json::Value::empty((Value *)&local_238);
    if (!bVar20) {
      pVVar25 = Json::Value::operator[](__return_storage_ptr__,"artifacts");
      Json::Value::operator=(pVVar25,(Value *)&local_238);
    }
    Json::Value::~Value((Value *)&local_238);
  }
  iVar22 = (int)paVar50;
  if (iVar22 - 2U < 2) {
LAB_00477134:
    cmGeneratorTarget::GetFullName((string *)&local_290,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value((Value *)&local_1e0,(String *)&local_290);
    pVVar25 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar25,(Value *)&local_1e0);
    Json::Value::~Value((Value *)&local_1e0);
    if (local_290 != &aStack_280) {
      operator_delete(local_290.string_,(ulong)(aStack_280._M_allocated_capacity + 1));
    }
    Json::Value::Value((Value *)&local_290,objectValue);
    cmGeneratorTarget::GetLinkerLanguage((string *)&local_238,this->GT,this->Config);
    Json::Value::Value((Value *)&local_1e0,(String *)&local_238);
    pVVar25 = Json::Value::operator[]((Value *)&local_290,"language");
    Json::Value::operator=(pVVar25,(Value *)&local_1e0);
    Json::Value::~Value((Value *)&local_1e0);
    DumpLinkCommandFragments((Value *)&local_1e0,this);
    bVar20 = Json::Value::empty((Value *)&local_1e0);
    if (!bVar20) {
      pVVar25 = Json::Value::operator[]((Value *)&local_290,"commandFragments");
      Json::Value::operator=(pVVar25,(Value *)&local_1e0);
    }
    Json::Value::~Value((Value *)&local_1e0);
    pcVar3 = this->GT->Makefile;
    local_260.int_ = 0x12;
    local_1e0.string_ = (char *)&local_1d0;
    local_1e0.int_ = std::__cxx11::string::_M_create(&local_1e0.uint_,(ulong)&local_260);
    local_1d0._M_allocated_capacity._0_4_ = (undefined4)local_260.int_;
    local_1d0._M_local_buf[4] = (char)((ulong)local_260 >> 0x20);
    local_1d0._M_local_buf[5] = (char)((ulong)local_260 >> 0x28);
    local_1d0._M_local_buf[6] = (char)((ulong)local_260 >> 0x30);
    local_1d0._M_local_buf[7] = (char)((ulong)local_260 >> 0x38);
    builtin_strncpy((char *)local_1e0,"CMAKE_SY",8);
    *(undefined8 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(local_1e0.map_)->_M_t)->_M_local_buf + 8) = 0x494c5f544f4f5253;
    *(undefined2 *)
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&(local_1e0.map_)->_M_t + 1) = 0x4b4e;
    local_1d8.int_ = local_260.int_;
    local_1e0.string_[local_260.string_] = '\0';
    cVar30 = cmMakefile::GetDefinition(pcVar3,(string *)&local_1e0);
    psVar27 = extraout_RDX;
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0.string_,
                      CONCAT17(local_1d0._M_local_buf[7],
                               CONCAT16(local_1d0._M_local_buf[6],
                                        CONCAT15(local_1d0._M_local_buf[5],
                                                 CONCAT14(local_1d0._M_local_buf[4],
                                                          local_1d0._M_allocated_capacity._0_4_))))
                      + 1);
      psVar27 = extraout_RDX_00;
    }
    if (cVar30.Value == (string *)0x0) {
      local_1d0._M_allocated_capacity._0_4_ = 0x4b414d43;
      local_1d0._M_local_buf[4] = 'E';
      local_1d0._M_local_buf[5] = '_';
      local_1d0._M_local_buf[6] = 'S';
      local_1d0._M_local_buf[7] = 'Y';
      local_1d0._8_5_ = 0x544f4f5253;
      local_1d8.int_ = 0xd;
      local_1d0._M_local_buf[0xd] = '\0';
      local_1e0.string_ = (char *)&local_1d0;
      cVar30 = cmMakefile::GetDefinition(this->GT->Makefile,(string *)&local_1e0);
      psVar27 = extraout_RDX_01;
      if (local_1e0 != &local_1d0) {
        operator_delete(local_1e0.string_,
                        CONCAT17(local_1d0._M_local_buf[7],
                                 CONCAT16(local_1d0._M_local_buf[6],
                                          CONCAT15(local_1d0._M_local_buf[5],
                                                   CONCAT14(local_1d0._M_local_buf[4],
                                                            local_1d0._M_allocated_capacity._0_4_)))
                                ) + 1);
        psVar27 = extraout_RDX_02;
      }
      if (cVar30.Value != (string *)0x0) {
        DumpSysroot((Value *)&local_1e0,(Target *)cVar30.Value,psVar27);
        pVVar25 = Json::Value::operator[]((Value *)&local_290,"sysroot");
        goto LAB_0047739a;
      }
    }
    else {
      DumpSysroot((Value *)&local_1e0,(Target *)cVar30.Value,psVar27);
      pVVar25 = Json::Value::operator[]((Value *)&local_290,"sysroot");
LAB_0047739a:
      Json::Value::operator=(pVVar25,(Value *)&local_1e0);
      Json::Value::~Value((Value *)&local_1e0);
    }
    bVar20 = cmGeneratorTarget::IsIPOEnabled(this->GT,(string *)&local_238,this->Config);
    if (bVar20) {
      Json::Value::Value((Value *)&local_1e0,true);
      pVVar25 = Json::Value::operator[]((Value *)&local_290,"lto");
      Json::Value::operator=(pVVar25,(Value *)&local_1e0);
      Json::Value::~Value((Value *)&local_1e0);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238.string_,local_228.int_ + 1);
    }
    pVVar25 = Json::Value::operator[](__return_storage_ptr__,"link");
  }
  else {
    if (iVar22 != 1) {
      if (iVar22 != 0) goto LAB_004775d5;
      goto LAB_00477134;
    }
    cmGeneratorTarget::GetFullName((string *)&local_290,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value((Value *)&local_1e0,(String *)&local_290);
    pVVar25 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar25,(Value *)&local_1e0);
    Json::Value::~Value((Value *)&local_1e0);
    if (local_290 != &aStack_280) {
      operator_delete(local_290.string_,(ulong)(aStack_280._M_allocated_capacity + 1));
    }
    Json::Value::Value((Value *)&local_290,objectValue);
    DumpLinkCommandFragments((Value *)&local_1e0,this);
    bVar20 = Json::Value::empty((Value *)&local_1e0);
    if (!bVar20) {
      pVVar25 = Json::Value::operator[]((Value *)&local_290,"commandFragments");
      Json::Value::operator=(pVVar25,(Value *)&local_1e0);
    }
    Json::Value::~Value((Value *)&local_1e0);
    cmGeneratorTarget::GetLinkerLanguage((string *)&local_238,this->GT,this->Config);
    bVar20 = cmGeneratorTarget::IsIPOEnabled(this->GT,(string *)&local_238,this->Config);
    if (bVar20) {
      Json::Value::Value((Value *)&local_1e0,true);
      pVVar25 = Json::Value::operator[]((Value *)&local_290,"lto");
      Json::Value::operator=(pVVar25,(Value *)&local_1e0);
      Json::Value::~Value((Value *)&local_1e0);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238.string_,local_228.int_ + 1);
    }
    pVVar25 = Json::Value::operator[](__return_storage_ptr__,"archive");
  }
  Json::Value::operator=(pVVar25,(Value *)&local_290);
  Json::Value::~Value((Value *)&local_290);
LAB_004775d5:
  Json::Value::Value((Value *)&local_f0,arrayValue);
  this_01 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
  pTVar31 = cmGlobalGenerator::GetTargetDirectDepends(this_01,this->GT);
  p_Var32 = (pTVar31->
            super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
            _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var48 = &(pTVar31->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
             _M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var32 != p_Var48) {
    do {
      Json::Value::Value((Value *)&local_290,objectValue);
      TargetId((string *)&local_238,*(cmGeneratorTarget **)(p_Var32 + 1),psVar24);
      Json::Value::Value((Value *)&local_1e0,(String *)&local_238);
      pVVar25 = Json::Value::operator[]((Value *)&local_290,"id");
      Json::Value::operator=(pVVar25,(Value *)&local_1e0);
      Json::Value::~Value((Value *)&local_1e0);
      if (local_238 != &local_228) {
        operator_delete(local_238.string_,local_228.int_ + 1);
      }
      AddBacktrace(this,(Value *)&local_290,(cmListFileBacktrace *)&p_Var32[1]._M_left);
      Json::Value::append((Value *)&local_f0,(Value *)&local_290);
      Json::Value::~Value((Value *)&local_290);
      p_Var32 = (_Base_ptr)std::_Rb_tree_increment(p_Var32);
    } while ((_Rb_tree_header *)p_Var32 != p_Var48);
  }
  bVar20 = Json::Value::empty((Value *)&local_f0);
  if (!bVar20) {
    pVVar25 = Json::Value::operator[](__return_storage_ptr__,"dependencies");
    Json::Value::operator=(pVVar25,(Value *)&local_f0);
  }
  local_230.int_._0_4_ = 0;
  local_228.int_ = 0;
  local_210 = 0;
  local_220 = &local_230;
  local_218 = &local_230;
  cmGeneratorTarget::GetLanguages
            (this->GT,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_238,this->Config);
  if (local_220 != &local_230) {
    local_100 = (_Base_ptr)&this->CompileDataMap;
    local_f8 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_98 = &this->Backtraces;
    pVVar41 = local_220;
    do {
      __x = pVVar41 + 4;
      local_88 = pVVar41;
      iVar33 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
               ::lower_bound(local_100,(key_type *)__x);
      if ((iVar33._M_node == local_f8) ||
         (iVar22 = std::__cxx11::string::compare((string *)&__x->bool_), iVar22 < 0)) {
        this_02 = (_Rb_tree_node_base *)operator_new(0x118);
        __k = (_Link_type)(this_02 + 1);
        *(_Base_ptr **)(this_02 + 1) = &this_02[1]._M_left;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__k,local_88[4].string_,local_88[4].string_ + local_88[5].int_);
        *(undefined8 *)(this_02 + 3) = 0;
        this_02[3]._M_parent = (_Base_ptr)0x0;
        *(undefined8 *)(this_02 + 4) = 0;
        this_02[4]._M_parent = (_Base_ptr)0x0;
        this_02[4]._M_left = (_Base_ptr)0x0;
        this_02[4]._M_right = (_Base_ptr)0x0;
        this_02[3]._M_left = (_Base_ptr)0x0;
        this_02[3]._M_right = (_Base_ptr)0x0;
        this_02[2]._M_left = (_Base_ptr)0x0;
        this_02[2]._M_right = (_Base_ptr)0x0;
        *(_Base_ptr **)(this_02 + 2) = &this_02[2]._M_left;
        this_02[2]._M_parent = (_Base_ptr)0x0;
        *(_Base_ptr **)(this_02 + 3) = &this_02[3]._M_left;
        *(_Base_ptr **)(this_02 + 4) = &this_02[4]._M_left;
        *(undefined8 *)(this_02 + 5) = 0;
        this_02[5]._M_parent = (_Base_ptr)0x0;
        this_02[5]._M_left = (_Base_ptr)0x0;
        this_02[5]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(this_02 + 6) = 0;
        this_02[6]._M_parent = (_Base_ptr)0x0;
        this_02[6]._M_left = (_Base_ptr)0x0;
        this_02[6]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(this_02 + 7) = 0;
        this_02[7]._M_parent = (_Base_ptr)0x0;
        this_02[7]._M_left = (_Base_ptr)0x0;
        this_02[7]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(this_02 + 8) = 0;
        this_02[8]._M_parent = (_Base_ptr)0x0;
        this_02[8]._M_left = (_Base_ptr)0x0;
        if (iVar33._M_node == local_f8) {
          if (((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (__p = __k,
             iVar22 = std::__cxx11::string::compare
                                ((string *)
                                 ((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_right + 1)), -1 < iVar22)) {
LAB_00477964:
            __p = __k;
            pVar67 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                     ::_M_get_insert_unique_pos
                               ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                                 *)local_100,(key_type *)__k);
          }
          else {
            p_Var53 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_0047792d:
            auVar11._8_8_ = 0;
            auVar11._0_8_ = p_Var53;
            pVar67 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar11 << 0x40);
          }
LAB_0047797a:
          iVar33._M_node = pVar67.first;
          if (pVar67.second == (_Rb_tree_node_base *)0x0) {
LAB_004779c9:
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
            ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                            *)this_02,__p);
            goto LAB_004779d4;
          }
LAB_00477982:
          iVar33._M_node = pVar67.second;
          bVar20 = true;
          if ((local_f8 != iVar33._M_node) && (pVar67.first == (_Rb_tree_node_base *)0x0)) {
            std::__cxx11::string::compare((string *)__k);
            bVar20 = (bool)(extraout_var >> 7);
          }
        }
        else {
          __p = (_Link_type)(iVar33._M_node + 1);
          iVar22 = std::__cxx11::string::compare((string *)__k);
          if (-1 < iVar22) {
            __p = __k;
            iVar22 = std::__cxx11::string::compare((string *)(iVar33._M_node + 1));
            if (iVar22 < 0) {
              p_Var53 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
              ;
              if (p_Var53 == iVar33._M_node) goto LAB_0047792d;
              p_Var34 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar33._M_node);
              pVar67.second = p_Var34;
              pVar67.first = p_Var34;
              __p = (_Link_type)(p_Var34 + 1);
              iVar22 = std::__cxx11::string::compare((string *)__k);
              if (-1 < iVar22) goto LAB_00477964;
              iVar35 = iVar33;
              if ((iVar33._M_node)->_M_right == (_Base_ptr)0x0) goto LAB_0047832d;
              goto LAB_0047797a;
            }
            goto LAB_004779c9;
          }
          p_Var53 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pVar67.second = p_Var53;
          pVar67.first = p_Var53;
          if (p_Var53 == iVar33._M_node) goto LAB_0047797a;
          iVar35._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar33._M_node);
          iVar22 = std::__cxx11::string::compare((string *)(iVar35._M_node + 1));
          if (-1 < iVar22) goto LAB_00477964;
          bVar20 = true;
          if ((iVar35._M_node)->_M_right == (_Base_ptr)0x0) {
LAB_0047832d:
            auVar10._8_8_ = 0;
            auVar10._0_8_ = iVar35._M_node;
            pVar67 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar10 << 0x40);
            goto LAB_00477982;
          }
        }
        std::_Rb_tree_insert_and_rebalance(bVar20,this_02,iVar33._M_node,local_f8);
        psVar2 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        *psVar2 = *psVar2 + 1;
        iVar33._M_node = this_02;
      }
LAB_004779d4:
      std::__cxx11::string::_M_assign((string *)(iVar33._M_node + 2));
      pcVar3 = this->GT->Makefile;
      local_1e0.string_ = (char *)&local_1d0;
      local_290.int_ = 0x15;
      local_1e0.int_ = std::__cxx11::string::_M_create(&local_1e0.uint_,(ulong)&local_290);
      local_1d0._M_allocated_capacity._0_4_ = (undefined4)local_290.int_;
      local_1d0._M_local_buf[4] = (char)((ulong)local_290 >> 0x20);
      local_1d0._M_local_buf[5] = (char)((ulong)local_290 >> 0x28);
      local_1d0._M_local_buf[6] = (char)((ulong)local_290 >> 0x30);
      local_1d0._M_local_buf[7] = (char)((ulong)local_290 >> 0x38);
      builtin_strncpy((char *)local_1e0,"CMAKE_SY",8);
      builtin_strncpy((char *)((long)&(local_1e0.map_)->_M_t + 8),"SROOT_CO",8);
      builtin_strncpy((char *)((long)&(local_1e0.map_)->_M_t + 0xd),"_COMPILE",8);
      local_1d8.int_ = local_290.int_;
      local_1e0.string_[local_290.string_] = '\0';
      cVar30 = cmMakefile::GetDefinition(pcVar3,(string *)&local_1e0);
      if (local_1e0 != &local_1d0) {
        operator_delete(local_1e0.string_,
                        CONCAT17(local_1d0._M_local_buf[7],
                                 CONCAT16(local_1d0._M_local_buf[6],
                                          CONCAT15(local_1d0._M_local_buf[5],
                                                   CONCAT14(local_1d0._M_local_buf[4],
                                                            local_1d0._M_allocated_capacity._0_4_)))
                                ) + 1);
      }
      if (cVar30.Value == (string *)0x0) {
        local_1d0._8_5_ = 0x544f4f5253;
        local_1d0._M_allocated_capacity._0_4_ = 0x4b414d43;
        local_1d0._M_local_buf[4] = 'E';
        local_1d0._M_local_buf[5] = '_';
        local_1d0._M_local_buf[6] = 'S';
        local_1d0._M_local_buf[7] = 'Y';
        local_1d8.int_ = 0xd;
        local_1d0._M_local_buf[0xd] = '\0';
        local_1e0.string_ = (char *)&local_1d0;
        cVar30 = cmMakefile::GetDefinition(this->GT->Makefile,(string *)&local_1e0);
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0.string_,
                          CONCAT17(local_1d0._M_local_buf[7],
                                   CONCAT16(local_1d0._M_local_buf[6],
                                            CONCAT15(local_1d0._M_local_buf[5],
                                                     CONCAT14(local_1d0._M_local_buf[4],
                                                              local_1d0._M_allocated_capacity._0_4_)
                                                    ))) + 1);
        }
        if (cVar30.Value != (string *)0x0) goto LAB_00477b11;
      }
      else {
LAB_00477b11:
        std::__cxx11::string::_M_assign((string *)(iVar33._M_node + 3));
      }
      pcVar26 = cmGeneratorTarget::GetLocalGenerator(this->GT);
      local_1d8.int_ = 0;
      local_1d0._M_allocated_capacity._0_4_ = local_1d0._M_allocated_capacity._0_4_ & 0xffffff00;
      local_1e0.string_ = (char *)&local_1d0;
      cmLocalGenerator::GetTargetCompileFlags
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_290,pcVar26,this->GT,this->Config,(string *)__x,(string *)&local_1e0);
      if (local_1e0 != &local_1d0) {
        operator_delete(local_1e0.string_,
                        CONCAT17(local_1d0._M_local_buf[7],
                                 CONCAT16(local_1d0._M_local_buf[6],
                                          CONCAT15(local_1d0._M_local_buf[5],
                                                   CONCAT14(local_1d0._M_local_buf[4],
                                                            local_1d0._M_allocated_capacity._0_4_)))
                                ) + 1);
      }
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&iVar33._M_node[5]._M_right,
                ((long)local_288.string_ - (long)local_290 >> 4) * -0x5555555555555555);
      VVar54 = local_288;
      for (VVar61 = local_290; VVar61.int_ != VVar54.int_;
          VVar61.string_ = (char *)(VVar61.int_ + 0x30)) {
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e0,this,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)VVar61.map_);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&iVar33._M_node[5]._M_right,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e0);
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0.string_,
                          CONCAT17(local_1d0._M_local_buf[7],
                                   CONCAT16(local_1d0._M_local_buf[6],
                                            CONCAT15(local_1d0._M_local_buf[5],
                                                     CONCAT14(local_1d0._M_local_buf[4],
                                                              local_1d0._M_allocated_capacity._0_4_)
                                                    ))) + 1);
        }
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_290);
      cmLocalGenerator::GetTargetDefines
                ((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_290,pcVar26,this->GT,this->Config,(string *)__x);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&iVar33._M_node[6]._M_left,local_268);
      for (uVar36 = aStack_280._8_8_; (ValueHolder *)uVar36 != &local_288;
          uVar36 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar36)) {
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e0,this,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(uVar36 + 0x20));
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&iVar33._M_node[6]._M_left,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e0);
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0.string_,
                          CONCAT17(local_1d0._M_local_buf[7],
                                   CONCAT16(local_1d0._M_local_buf[6],
                                            CONCAT15(local_1d0._M_local_buf[5],
                                                     CONCAT14(local_1d0._M_local_buf[4],
                                                              local_1d0._M_allocated_capacity._0_4_)
                                                    ))) + 1);
        }
      }
      cmLocalGenerator::GetIncludeDirectories
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_208,pcVar26,this->GT,(string *)__x,this->Config);
      local_108 = local_200;
      VVar54 = local_208;
      if (local_208 != local_200) {
        do {
          (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                    ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_260,this,
                     (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)VVar54.map_);
          VVar51 = VVar54;
          bVar20 = cmGeneratorTarget::IsSystemIncludeDirectory
                             (this->GT,VVar54,this->Config,(string *)__x);
          VVar61 = local_258;
          pVVar41 = (ValueHolder *)iVar33._M_node[8]._M_parent;
          if (pVVar41 == (ValueHolder *)iVar33._M_node[8]._M_left) {
            local_90 = (ValueHolder)((ValueHolder *)(iVar33._M_node + 8))->map_;
            lVar47 = (long)pVVar41 - (long)local_90;
            if (lVar47 == 0x7fffffffffffffe0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar63 = (lVar47 >> 4) * -0x5555555555555555;
            uVar46 = uVar63 + (uVar63 == 0);
            p_Var66 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                       *)(uVar46 + uVar63);
            if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                 *)0x2aaaaaaaaaaaaa9 < p_Var66) {
              p_Var66 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         *)0x2aaaaaaaaaaaaaa;
            }
            if (CARRY8(uVar46,uVar63)) {
              p_Var66 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         *)0x2aaaaaaaaaaaaaa;
            }
            pIVar37 = std::
                      _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                      ::_M_allocate(p_Var66,VVar51.uint_);
            VVar51 = local_90;
            VVar61 = local_258;
            local_1d0._M_local_buf[5] = (char)((uint7)local_250._1_7_ >> 0x20);
            local_1d0._M_local_buf[6] = (char)((uint7)local_250._1_7_ >> 0x28);
            local_1d0._M_local_buf[7] = (char)((uint7)local_250._1_7_ >> 0x30);
            if (local_260 == &local_250) {
              local_260.string_ = (char *)&local_1d0;
              local_1d0._M_allocated_capacity._0_4_ =
                   (undefined4)
                   CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]);
              local_1d0._8_5_ = (undefined5)local_250._8_8_;
              local_1d0._M_local_buf[0xd] = (char)((ulong)local_250._8_8_ >> 0x28);
              local_1d0._14_2_ = (undefined2)((ulong)local_250._8_8_ >> 0x30);
            }
            else {
              local_1d0._M_allocated_capacity._0_4_ =
                   (undefined4)
                   CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]);
            }
            local_1d0._M_local_buf[4] = (char)((uint7)local_250._1_7_ >> 0x18);
            pVVar62 = (ValueHolder *)(lVar47 + (long)pIVar37);
            local_258.int_ = 0;
            local_250._M_local_buf[0] = '\0';
            pVVar62->string_ = (char *)(pVVar62 + 2);
            if (local_260 == &local_1d0) {
              VVar15.int_._4_1_ = local_1d0._M_local_buf[4];
              VVar15.int_._0_4_ = local_1d0._M_allocated_capacity._0_4_;
              VVar15.int_._5_1_ = local_1d0._M_local_buf[5];
              VVar15.int_._6_1_ = local_1d0._M_local_buf[6];
              VVar15.int_._7_1_ = local_1d0._M_local_buf[7];
              VVar17.int_._5_1_ = local_1d0._M_local_buf[0xd];
              VVar17.int_._0_5_ = local_1d0._8_5_;
              VVar17.int_._6_2_ = local_1d0._14_2_;
              pVVar62[2] = VVar15;
              pVVar62[3] = VVar17;
            }
            else {
              pVVar62->int_ = (LargestInt)local_260;
              VVar14.int_._4_1_ = local_1d0._M_local_buf[4];
              VVar14.int_._0_4_ = local_1d0._M_allocated_capacity._0_4_;
              VVar14.int_._5_1_ = local_1d0._M_local_buf[5];
              VVar14.int_._6_1_ = local_1d0._M_local_buf[6];
              VVar14.int_._7_1_ = local_1d0._M_local_buf[7];
              pVVar62[2] = VVar14;
            }
            pVVar62[1].map_ = (ObjectValues *)VVar61;
            *(ArrayIndex *)(pVVar62 + 4) = local_240.Index;
            pVVar62[5].bool_ = bVar20;
            local_260.string_ = (char *)&local_250;
            pIVar38 = std::
                      vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                      ::_S_relocate((pointer)local_90.map_,(pointer)pVVar41,pIVar37,
                                    (_Tp_alloc_type *)VVar61.map_);
            if (VVar51 != (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x0) {
              operator_delete(VVar51.string_,(long)iVar33._M_node[8]._M_left - (long)VVar51);
            }
            *(pointer *)(iVar33._M_node + 8) = pIVar37;
            iVar33._M_node[8]._M_parent = (_Base_ptr)(pIVar38 + 1);
            iVar33._M_node[8]._M_left = (_Base_ptr)(pIVar37 + (long)p_Var66);
          }
          else {
            local_1d0._M_local_buf[5] = (char)((uint7)local_250._1_7_ >> 0x20);
            local_1d0._M_local_buf[6] = (char)((uint7)local_250._1_7_ >> 0x28);
            local_1d0._M_local_buf[7] = (char)((uint7)local_250._1_7_ >> 0x30);
            if (local_260 == &local_250) {
              local_260.string_ = (char *)&local_1d0;
              local_1d0._M_allocated_capacity._0_4_ =
                   (undefined4)
                   CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]);
              local_1d0._8_5_ = (undefined5)local_250._8_8_;
              local_1d0._M_local_buf[0xd] = (char)((ulong)local_250._8_8_ >> 0x28);
              local_1d0._14_2_ = (undefined2)((ulong)local_250._8_8_ >> 0x30);
            }
            else {
              local_1d0._M_allocated_capacity._0_4_ =
                   (undefined4)
                   CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]);
            }
            local_1d0._M_local_buf[4] = (char)((uint7)local_250._1_7_ >> 0x18);
            local_258.int_ = 0;
            local_250._M_local_buf[0] = '\0';
            pVVar41->string_ = (char *)(pVVar41 + 2);
            if (local_260 == &local_1d0) {
              VVar51.int_._4_1_ = local_1d0._M_local_buf[4];
              VVar51.int_._0_4_ = local_1d0._M_allocated_capacity._0_4_;
              VVar51.int_._5_1_ = local_1d0._M_local_buf[5];
              VVar51.int_._6_1_ = local_1d0._M_local_buf[6];
              VVar51.int_._7_1_ = local_1d0._M_local_buf[7];
              VVar16.int_._5_1_ = local_1d0._M_local_buf[0xd];
              VVar16.int_._0_5_ = local_1d0._8_5_;
              VVar16.int_._6_2_ = local_1d0._14_2_;
              pVVar41[2] = VVar51;
              pVVar41[3] = VVar16;
            }
            else {
              pVVar41->int_ = (LargestInt)local_260;
              VVar13.int_._4_1_ = local_1d0._M_local_buf[4];
              VVar13.int_._0_4_ = local_1d0._M_allocated_capacity._0_4_;
              VVar13.int_._5_1_ = local_1d0._M_local_buf[5];
              VVar13.int_._6_1_ = local_1d0._M_local_buf[6];
              VVar13.int_._7_1_ = local_1d0._M_local_buf[7];
              pVVar41[2] = VVar13;
            }
            pVVar41[1].map_ = (ObjectValues *)VVar61;
            *(ArrayIndex *)(pVVar41 + 4) = local_240.Index;
            pVVar41[5].bool_ = bVar20;
            iVar33._M_node[8]._M_parent = (_Base_ptr)&iVar33._M_node[8]._M_parent[1]._M_left;
            local_260.string_ = (char *)&local_250;
          }
          if (local_260 != &local_250) {
            operator_delete(local_260.string_,
                            CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]
                                    ) + 1);
          }
          VVar54.string_ = (char *)(VVar54.int_ + 0x30);
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)VVar54.int_ != local_108);
      }
      cmGeneratorTarget::GetPrecompileHeaders
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_c8,this->GT,this->Config,(string *)__x);
      paVar50 = paStack_c0;
      if (local_c8 != paStack_c0) {
        VVar54 = local_c8;
        do {
          (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                    ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1e0,this,
                     (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)VVar54.map_);
          std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
          ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                    ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                      *)&iVar33._M_node[7]._M_parent,
                     (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1e0);
          if (local_1e0 != &local_1d0) {
            operator_delete(local_1e0.string_,
                            CONCAT17(local_1d0._M_local_buf[7],
                                     CONCAT16(local_1d0._M_local_buf[6],
                                              CONCAT15(local_1d0._M_local_buf[5],
                                                       CONCAT14(local_1d0._M_local_buf[4],
                                                                local_1d0._M_allocated_capacity.
                                                                _0_4_)))) + 1);
          }
          VVar54.string_ = (char *)(VVar54.int_ + 0x30);
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)VVar54.int_ != paVar50);
      }
      VVar54.map_ = (ObjectValues *)
                    cmGeneratorTarget::GetLanguageStandardProperty
                              (this->GT,(string *)__x,this->Config);
      if ((BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          VVar54.int_ !=
          (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          0x0) {
        paVar50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((VVar54.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
        local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((VVar54.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        local_90.map_ = VVar54.map_;
        if (paVar50 == local_108) {
          local_2a8 = (pointer)0x0;
          pJVar55 = (pointer)0x0;
          pJVar44 = (pointer)0x0;
        }
        else {
          pJVar55 = (pointer)0x0;
          local_2a8 = (pointer)0x0;
          pJVar49 = (pointer)0x0;
          do {
            paVar52 = paVar50;
            JVar23 = BacktraceData::Add(local_98,(cmListFileBacktrace *)paVar50);
            if (pJVar55 == local_2a8) {
              uVar63 = (long)pJVar55 - (long)pJVar49;
              if (uVar63 == 0x7ffffffffffffffc) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar39 = (long)uVar63 >> 2;
              uVar46 = uVar39;
              if (pJVar55 == pJVar49) {
                uVar46 = 1;
              }
              this_03 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                         *)(uVar46 + uVar39);
              if ((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                   *)0x1ffffffffffffffe < this_03) {
                this_03 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                           *)0x1fffffffffffffff;
              }
              if (CARRY8(uVar46,uVar39)) {
                this_03 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                           *)0x1fffffffffffffff;
              }
              pJVar44 = std::
                        _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                        ::_M_allocate(this_03,(size_t)paVar52);
              *(ArrayIndex *)((long)pJVar44 + uVar63) = JVar23.Index;
              pJVar57 = pJVar44;
              for (pJVar40 = pJVar49; pJVar55 != pJVar40; pJVar40 = pJVar40 + 1) {
                pJVar57->Index = pJVar40->Index;
                pJVar57 = pJVar57 + 1;
              }
              if (pJVar49 != (pointer)0x0) {
                operator_delete(pJVar49,uVar63);
              }
              local_2a8 = pJVar44 + (long)this_03;
            }
            else {
              pJVar55->Index = JVar23.Index;
              pJVar44 = pJVar49;
              pJVar57 = pJVar55;
            }
            pJVar55 = pJVar57 + 1;
            paVar50 = paVar50 + 1;
            pJVar49 = pJVar44;
          } while (paVar50 != local_108);
        }
        local_260.string_ = (char *)&local_250;
        __n_00 = *(size_t *)local_90.string_;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_260,__n_00,
                   *(size_type *)&((local_90.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header +
                   __n_00);
        local_1c0._0_8_ =
             std::
             _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
             ::_M_allocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                            *)((long)pJVar55 - (long)pJVar44 >> 2),__n_00);
        local_1e0.string_ = (char *)&local_1d0;
        local_1c0._8_8_ = local_1c0._0_8_;
        for (pJVar49 = pJVar44; pJVar49 != pJVar55; pJVar49 = pJVar49 + 1) {
          *(ArrayIndex *)&((cmGeneratorTarget *)local_1c0._8_8_)->Target = pJVar49->Index;
          local_1c0._8_8_ = (long)&((cmGeneratorTarget *)local_1c0._8_8_)->Target + 4;
        }
        local_1d0._M_local_buf[5] = (char)((uint7)local_250._1_7_ >> 0x20);
        local_1d0._M_local_buf[6] = (char)((uint7)local_250._1_7_ >> 0x28);
        local_1d0._M_local_buf[7] = (char)((uint7)local_250._1_7_ >> 0x30);
        if (local_260 == &local_250) {
          local_1d0._M_allocated_capacity._0_4_ =
               (undefined4)CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0])
          ;
          local_1d0._8_5_ = (undefined5)local_250._8_8_;
          local_1d0._M_local_buf[0xd] = (char)((ulong)local_250._8_8_ >> 0x28);
          local_1d0._14_2_ = (undefined2)((ulong)local_250._8_8_ >> 0x30);
        }
        else {
          local_1e0.int_ = local_260.int_;
          local_1d0._M_allocated_capacity._0_4_ =
               (undefined4)CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0])
          ;
        }
        local_1d0._M_local_buf[4] = (char)((uint7)local_250._1_7_ >> 0x18);
        local_1c0._16_8_ = local_1c0._0_8_ + ((long)pJVar55 - (long)pJVar44);
        local_1d8 = local_258;
        local_258.int_ = 0;
        local_250._M_local_buf[0] = '\0';
        local_260.string_ = (char *)&local_250;
        if (pJVar44 != (pointer)0x0) {
          operator_delete(pJVar44,(long)local_2a8 - (long)pJVar44);
        }
        std::__cxx11::string::operator=((string *)(iVar33._M_node + 4),(string *)&local_1e0.bool_);
        pvVar5 = *(void **)(iVar33._M_node + 5);
        p_Var32 = iVar33._M_node[5]._M_left;
        *(undefined8 *)(iVar33._M_node + 5) = local_1c0._0_8_;
        iVar33._M_node[5]._M_parent = (_Base_ptr)local_1c0._8_8_;
        iVar33._M_node[5]._M_left = (_Base_ptr)local_1c0._16_8_;
        local_1c0._0_8_ = (cmGeneratorTarget *)0x0;
        local_1c0._8_8_ = (string *)0x0;
        local_1c0._16_8_ = (pointer)0x0;
        if ((pvVar5 != (void *)0x0) &&
           (operator_delete(pvVar5,(long)p_Var32 - (long)pvVar5),
           (cmGeneratorTarget *)local_1c0._0_8_ != (cmGeneratorTarget *)0x0)) {
          operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ - local_1c0._0_8_);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0.string_,
                          CONCAT17(local_1d0._M_local_buf[7],
                                   CONCAT16(local_1d0._M_local_buf[6],
                                            CONCAT15(local_1d0._M_local_buf[5],
                                                     CONCAT14(local_1d0._M_local_buf[4],
                                                              local_1d0._M_allocated_capacity._0_4_)
                                                    ))) + 1);
        }
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_c8);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_208);
      std::
      _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_290);
      pVVar41 = (ValueHolder *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_88);
    } while (pVVar41 != &local_230);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_238);
  Json::Value::Value((Value *)&local_290,arrayValue);
  pKVar42 = cmGeneratorTarget::GetKindedSources(this->GT,this->Config);
  sk = (pKVar42->Sources).
       super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pSVar6 = (pKVar42->Sources).
           super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (sk != pSVar6) {
    do {
      si = Json::Value::size((Value *)&local_290);
      DumpSource((Value *)&local_1e0,this,sk,si);
      Json::Value::append((Value *)&local_290,(Value *)&local_1e0);
      Json::Value::~Value((Value *)&local_1e0);
      sk = sk + 1;
    } while (sk != pSVar6);
  }
  pVVar25 = Json::Value::operator[](__return_storage_ptr__,"sources");
  Json::Value::operator=(pVVar25,(Value *)&local_290);
  Json::Value::~Value((Value *)&local_290);
  Json::Value::Value((Value *)&local_c8,nullValue);
  local_1d0._M_allocated_capacity._0_4_ = 0x444c4f46;
  local_1d0._M_local_buf[4] = 'E';
  local_1d0._M_local_buf[5] = 'R';
  local_1d8 = (ValueHolder)0x6;
  local_1d0._M_local_buf[6] = '\0';
  local_1e0.string_ = (char *)&local_1d0;
  cVar30 = cmGeneratorTarget::GetProperty(this->GT,(string *)&local_1e0);
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0.string_,
                    CONCAT17(local_1d0._M_local_buf[7],
                             CONCAT16(local_1d0._M_local_buf[6],
                                      CONCAT15(local_1d0._M_local_buf[5],
                                               CONCAT14(local_1d0._M_local_buf[4],
                                                        local_1d0._M_allocated_capacity._0_4_)))) +
                    1);
  }
  if (cVar30.Value != (string *)0x0) {
    Json::Value::Value((Value *)&local_1e0,objectValue);
    Json::Value::operator=((Value *)&local_c8,(Value *)&local_1e0);
    Json::Value::~Value((Value *)&local_1e0);
    Json::Value::Value((Value *)&local_1e0,cVar30.Value);
    pVVar25 = Json::Value::operator[]((Value *)&local_c8,"name");
    Json::Value::operator=(pVVar25,(Value *)&local_1e0);
    Json::Value::~Value((Value *)&local_1e0);
  }
  bVar20 = Json::Value::isNull((Value *)&local_c8);
  if (!bVar20) {
    pVVar25 = Json::Value::operator[](__return_storage_ptr__,"folder");
    Json::Value::operator=(pVVar25,(Value *)&local_c8);
  }
  Json::Value::Value(&local_58,arrayValue);
  value = (this->SourceGroups).
          super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pSVar7 = (this->SourceGroups).
           super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (value != pSVar7) {
    do {
      Json::Value::Value((Value *)&local_290,objectValue);
      Json::Value::Value((Value *)&local_1e0,&value->Name);
      pVVar25 = Json::Value::operator[]((Value *)&local_290,"name");
      Json::Value::operator=(pVVar25,(Value *)&local_1e0);
      Json::Value::~Value((Value *)&local_1e0);
      pVVar25 = Json::Value::operator[]((Value *)&local_290,"sourceIndexes");
      Json::Value::operator=(pVVar25,&value->SourceIndexes);
      Json::Value::append(&local_58,(Value *)&local_290);
      Json::Value::~Value((Value *)&local_290);
      value = value + 1;
    } while (value != pSVar7);
  }
  bVar20 = Json::Value::empty(&local_58);
  if (!bVar20) {
    pVVar25 = Json::Value::operator[](__return_storage_ptr__,"sourceGroups");
    Json::Value::operator=(pVVar25,&local_58);
  }
  Json::Value::Value(&local_80,arrayValue);
  paVar50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(this->CompileGroups).
               super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_90 = (ValueHolder)
             (this->CompileGroups).
             super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (paVar50 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.int_) {
    local_f8 = (_Base_ptr)&this->CompileDataMap;
    local_100 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      sVar8 = paVar50->_M_allocated_capacity;
      local_1e0.string_ = (char *)&local_1d0;
      VVar54.int_ = 0;
      local_1d8 = (ValueHolder)0x0;
      local_1d0._M_allocated_capacity._0_4_ = local_1d0._M_allocated_capacity._0_4_ & 0xffffff00;
      local_1c0._0_8_ = local_1c0 + 0x10;
      local_1c0._8_8_ = (string *)0x0;
      local_1c0._16_8_ = local_1c0._16_8_ & 0xffffffffffffff00;
      local_1a0._M_allocated_capacity = (size_type)&local_190;
      local_190._M_local_buf[0] = '\0';
      local_1a0._8_8_ = 0;
      local_110 = (pointer)0x0;
      local_120 = (pointer)0x0;
      cStack_118._M_current = (pointer)0x0;
      local_130 = (pointer)0x0;
      _Stack_128._M_nxt = (_Hash_node_base *)0x0;
      local_150._16_8_ = (pointer)0x0;
      pJStack_138 = (pointer)0x0;
      local_150._0_8_ =
           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
           0x0;
      local_150._8_8_ =
           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
           0x0;
      vStack_168.
      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_168.
      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_170 = (pointer)0x0;
      vStack_168.
      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_180._M_allocated_capacity = 0;
      local_180._8_8_ = (pointer)0x0;
      local_108 = paVar50;
      std::__cxx11::string::_M_assign((string *)&local_1e0.bool_);
      pJVar45 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_150._8_8_;
      if (local_1d8 != (ValueHolder)0x0) {
        iVar33 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                 ::lower_bound(local_f8,(key_type *)&local_1e0);
        if ((iVar33._M_node == local_100) ||
           (iVar22 = std::__cxx11::string::compare((string *)&local_1e0.bool_), iVar22 < 0)) {
          std::__throw_out_of_range("map::at");
        }
        p_Var53 = iVar33._M_node + 3;
        std::__cxx11::string::_M_assign((string *)local_1c0);
        iVar35 = iVar33;
        if ((pointer *)&iVar33._M_node[7]._M_parent != &pJStack_138) {
          p_Var32 = iVar33._M_node[7]._M_parent;
          p_Var59 = iVar33._M_node[7]._M_left;
          local_98 = (BacktraceData *)((long)p_Var59 - (long)p_Var32);
          local_88 = (ValueHolder *)iVar33;
          if ((BacktraceData *)((long)_Stack_128._M_nxt - (long)pJStack_138) < local_98) {
            pJVar43 = std::
                      _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::_M_allocate((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)(((long)local_98 >> 3) * -0x3333333333333333),(size_t)p_Var53
                                   );
            pJVar56 = pJVar43;
            pJVar65 = local_130;
            for (; local_130 = pJVar65, p_Var32 != p_Var59;
                p_Var32 = (_Base_ptr)&p_Var32[1]._M_parent) {
              (pJVar56->Value)._M_dataplus._M_p = (pointer)&(pJVar56->Value).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)pJVar56,*(long *)p_Var32,
                         (long)&p_Var32->_M_parent->_M_color + *(long *)p_Var32);
              (pJVar56->Backtrace).Index = p_Var32[1]._M_color;
              pJVar56 = pJVar56 + 1;
              pJVar65 = local_130;
            }
            if (pJStack_138 != pJVar65) {
              paVar50 = &(pJStack_138->Value).field_2;
              do {
                plVar9 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar50 + -1))->_M_dataplus)._M_p;
                if (paVar50 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar9) {
                  operator_delete(plVar9,paVar50->_M_allocated_capacity + 1);
                }
                pJVar56 = (pointer)((long)paVar50 + 0x18);
                paVar50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)paVar50 + 0x28);
              } while (pJVar56 != pJVar65);
            }
            if (pJStack_138 != (pointer)0x0) {
              operator_delete(pJStack_138,(long)_Stack_128._M_nxt - (long)pJStack_138);
            }
            _Stack_128._M_nxt =
                 (_Hash_node_base *)
                 ((long)&(local_98->TopSource)._M_dataplus._M_p +
                 (long)&(pJVar43->Value)._M_dataplus._M_p);
            pJStack_138 = pJVar43;
          }
          else {
            pBVar58 = (BacktraceData *)((long)local_130 - (long)pJStack_138);
            if (pBVar58 < local_98) {
              if (0 < (long)pBVar58) {
                uVar63 = (ulong)pBVar58 / 0x28 + 1;
                pJVar56 = pJStack_138;
                do {
                  std::__cxx11::string::_M_assign((string *)pJVar56);
                  (pJVar56->Backtrace).Index = p_Var32[1]._M_color;
                  p_Var32 = (_Base_ptr)&p_Var32[1]._M_parent;
                  pJVar56 = pJVar56 + 1;
                  uVar63 = uVar63 - 1;
                } while (1 < uVar63);
                p_Var32 = iVar33._M_node[7]._M_parent;
                p_Var59 = iVar33._M_node[7]._M_left;
                pBVar58 = (BacktraceData *)((long)local_130 - (long)pJStack_138);
              }
              pJVar56 = local_130;
              for (p_Var32 = (_Base_ptr)((long)&p_Var32->_M_color + (long)&pBVar58->TopSource);
                  p_Var32 != p_Var59; p_Var32 = (_Base_ptr)&p_Var32[1]._M_parent) {
                (pJVar56->Value)._M_dataplus._M_p = (pointer)&(pJVar56->Value).field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)pJVar56,*(long *)p_Var32,
                           (long)&p_Var32->_M_parent->_M_color + *(long *)p_Var32);
                (pJVar56->Backtrace).Index = p_Var32[1]._M_color;
                pJVar56 = pJVar56 + 1;
              }
            }
            else {
              pJVar56 = pJStack_138;
              pJVar65 = pJStack_138;
              if (0 < (long)local_98) {
                uVar63 = (ulong)local_98 / 0x28 + 1;
                do {
                  std::__cxx11::string::_M_assign((string *)pJVar56);
                  (pJVar56->Backtrace).Index = p_Var32[1]._M_color;
                  p_Var32 = (_Base_ptr)&p_Var32[1]._M_parent;
                  pJVar56 = pJVar56 + 1;
                  uVar63 = uVar63 - 1;
                  pJVar65 = pJVar65 + 1;
                } while (1 < uVar63);
              }
              pJVar43 = local_130;
              if (pJVar56 != local_130) {
                paVar50 = &(pJVar65->Value).field_2;
                do {
                  plVar9 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(paVar50 + -1))->_M_dataplus)._M_p;
                  if (paVar50 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar9) {
                    operator_delete(plVar9,paVar50->_M_allocated_capacity + 1);
                  }
                  pJVar56 = (pointer)((long)paVar50 + 0x18);
                  paVar50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)paVar50 + 0x28);
                } while (pJVar56 != pJVar43);
              }
            }
          }
          local_130 = (pointer)((long)&(pJStack_138->Value)._M_dataplus._M_p +
                               (long)&(local_98->TopSource)._M_dataplus._M_p);
          iVar35._M_node = (_Base_ptr)local_88;
        }
        paVar50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)iVar35._M_node + 0x80);
        std::__cxx11::string::_M_assign((string *)local_1a0._M_local_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)iVar35._M_node + 0x80) != &local_1a0) {
          p_Var32 = *(_Base_ptr *)(iVar33._M_node + 5);
          p_Var59 = iVar33._M_node[5]._M_parent;
          uVar63 = (long)p_Var59 - (long)p_Var32;
          if ((ulong)((long)local_170 - local_180._0_8_) < uVar63) {
            pJVar44 = std::
                      _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                      ::_M_allocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                                     *)((long)uVar63 >> 2),(size_t)paVar50);
            if (p_Var32 != p_Var59) {
              memcpy(pJVar44,p_Var32,uVar63 & 0xfffffffffffffffc);
            }
            if ((pointer)local_180._M_allocated_capacity != (pointer)0x0) {
              operator_delete((void *)local_180._M_allocated_capacity,
                              (long)local_170 - local_180._0_8_);
            }
            local_170 = (pointer)((long)pJVar44 + uVar63);
            local_180._M_allocated_capacity = (size_type)pJVar44;
          }
          else {
            __n = local_180._8_8_ - local_180._0_8_;
            if (__n < uVar63) {
              if (local_180._8_8_ != local_180._M_allocated_capacity) {
                memmove((void *)local_180._M_allocated_capacity,p_Var32,__n);
                p_Var32 = *(_Base_ptr *)(iVar33._M_node + 5);
                p_Var59 = iVar33._M_node[5]._M_parent;
                __n = local_180._8_8_ - local_180._0_8_;
              }
              for (p_Var32 = (_Base_ptr)((long)&p_Var32->_M_color + __n); p_Var32 != p_Var59;
                  p_Var32 = (_Base_ptr)&p_Var32->field_0x4) {
                ((pointer)local_180._8_8_)->Index = p_Var32->_M_color;
                local_180._8_8_ = local_180._8_8_ + 4;
              }
            }
            else if (p_Var59 != p_Var32) {
              memmove((void *)local_180._M_allocated_capacity,p_Var32,uVar63);
            }
          }
          local_180._8_8_ = local_180._M_allocated_capacity + uVar63;
        }
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::reserve(&vStack_168,
                  (*(long *)(sVar8 + 0x88) - *(long *)(sVar8 + 0x80) >> 3) * -0x3333333333333333 +
                  (*(long *)(iVar33._M_node + 6) - (long)iVar33._M_node[5]._M_right >> 3) *
                  -0x3333333333333333);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&vStack_168,
                   (const_iterator)
                   vStack_168.
                   super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)iVar33._M_node[5]._M_right,
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)(iVar33._M_node + 6));
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&vStack_168,
                   (const_iterator)
                   vStack_168.
                   super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)(sVar8 + 0x80),
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)(sVar8 + 0x88));
        cVar19._M_current = cStack_118._M_current;
        pIVar37 = local_120;
        __first._M_current = *(IncludeEntry **)(sVar8 + 200);
        __last._M_current = *(IncludeEntry **)(sVar8 + 0xd0);
        p_Var66 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   *)(((long)iVar33._M_node[8]._M_parent - *(long *)(iVar33._M_node + 8) >> 4) *
                      -0x5555555555555555 +
                     ((long)__last._M_current - (long)__first._M_current >> 4) * -0x5555555555555555
                     );
        if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
             *)0x2aaaaaaaaaaaaaa < p_Var66) {
          std::__throw_length_error("vector::reserve");
        }
        if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
             *)(((long)local_110 - (long)local_120 >> 4) * -0x5555555555555555) < p_Var66) {
          __result = std::
                     _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                     ::_M_allocate(p_Var66,0xaaaaaaaaaaaaaaab);
          std::
          vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ::_S_relocate(local_120,cStack_118._M_current,__result,(_Tp_alloc_type *)__last._M_current
                       );
          if (local_120 != (pointer)0x0) {
            operator_delete(local_120,(long)local_110 - (long)local_120);
          }
          cStack_118._M_current = cVar19._M_current + ((long)__result - (long)pIVar37);
          local_110 = __result + (long)p_Var66;
          __first._M_current = *(IncludeEntry **)(sVar8 + 200);
          __last._M_current = *(IncludeEntry **)(sVar8 + 0xd0);
          local_120 = __result;
        }
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&local_120,cStack_118,__first,__last);
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&local_120,cStack_118,*(IncludeEntry **)(iVar33._M_node + 8),
                   (IncludeEntry *)iVar33._M_node[8]._M_parent);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_150,
                  (*(long *)(sVar8 + 0xa0) - *(long *)(sVar8 + 0x98) >> 3) * -0x3333333333333333 +
                  ((long)iVar33._M_node[6]._M_right - (long)iVar33._M_node[6]._M_left >> 3) *
                  -0x3333333333333333);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)local_150,(const_iterator)local_150._8_8_,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)iVar33._M_node[6]._M_left,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)iVar33._M_node[6]._M_right);
        VVar54 = *(ValueHolder *)(sVar8 + 0xa0);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)local_150,(const_iterator)local_150._8_8_,
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)(sVar8 + 0x98),
                   (__normal_iterator<const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )VVar54);
        uVar18 = local_150._8_8_;
        uVar36 = local_150._0_8_;
        pJVar45 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_150._8_8_;
        if (local_150._0_8_ != local_150._8_8_) {
          lVar47 = ((long)(local_150._8_8_ - local_150._0_8_) >> 3) * -0x3333333333333333;
          local_290.int_ = (lVar47 - (lVar47 + 1 >> 0x3f)) + 1 >> 1;
          VVar61.string_ = (char *)&local_288;
          local_288.int_ = 0;
          aStack_280._M_allocated_capacity = 0;
          VVar54.string_ = VVar61.string_;
          VVar51.int_ = local_290.int_;
          if (0 < (long)(local_150._8_8_ - local_150._0_8_)) {
LAB_00478e01:
            VVar54 = VVar51;
            pJVar45 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)operator_new(VVar54.int_ * 0x28,(nothrow_t *)&std::nothrow);
            if (pJVar45 ==
                (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) goto code_r0x00478e1a;
            if (VVar54 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
              paVar50 = &(pJVar45->Value).field_2;
              (pJVar45->Value)._M_dataplus._M_p = (pointer)paVar50;
              pcVar4 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar36
                        )->_M_dataplus)._M_p;
              paVar52 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         uVar36)->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar4 == paVar52) {
                uVar12 = *(undefined8 *)
                          ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)uVar36)->field_2 + 8);
                paVar50->_M_allocated_capacity = paVar52->_M_allocated_capacity;
                *(undefined8 *)((long)&(pJVar45->Value).field_2 + 8) = uVar12;
              }
              else {
                (pJVar45->Value)._M_dataplus._M_p = pcVar4;
                (pJVar45->Value).field_2._M_allocated_capacity = paVar52->_M_allocated_capacity;
              }
              (pJVar45->Value)._M_string_length =
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar36)->
                   _M_string_length;
              (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar36)->
              _M_dataplus)._M_p = (pointer)paVar52;
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar36)->
              _M_string_length = 0;
              (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar36)->
              field_2)._M_local_buf[0] = '\0';
              (pJVar45->Backtrace).Index = ((JBTIndex *)(uVar36 + 0x20))->Index;
              pJVar60 = pJVar45;
              if (VVar54 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x1) {
                lVar47 = VVar54.int_ * 0x28 + -0x28;
                paVar50 = &pJVar45[1].Value.field_2;
                do {
                  paVar52 = paVar50;
                  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (paVar52 + -1))->_M_dataplus)._M_p = (pointer)paVar52;
                  psVar1 = (size_type *)((long)paVar52 + -0x28);
                  if (psVar1 == *(size_type **)((long)paVar52 + -0x38)) {
                    paVar52->_M_allocated_capacity = *psVar1;
                    *(size_type *)((long)paVar52 + 8) = paVar52[-2]._M_allocated_capacity;
                  }
                  else {
                    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (paVar52 + -1))->_M_dataplus)._M_p =
                         (pointer)*(size_type **)((long)paVar52 + -0x38);
                    paVar52->_M_allocated_capacity = *(size_type *)((long)paVar52 + -0x28);
                  }
                  *(size_type *)((long)paVar52 + -8) = paVar52[-3]._M_allocated_capacity;
                  *(size_type **)((long)paVar52 + -0x38) = psVar1;
                  paVar52[-3]._M_allocated_capacity = 0;
                  *(undefined1 *)((long)paVar52 + -0x28) = 0;
                  *(undefined4 *)(paVar52 + 1) = *(undefined4 *)((long)paVar52 + -0x18);
                  lVar47 = lVar47 + -0x28;
                  paVar50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)paVar52 + 0x28);
                } while (lVar47 != 0);
                pJVar60 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(paVar52 + -1);
              }
              std::__cxx11::string::operator=((string *)uVar36,(string *)pJVar60);
              ((JBTIndex *)(uVar36 + 0x20))->Index = (pJVar60->Backtrace).Index;
            }
            local_288 = VVar54;
            aStack_280._M_allocated_capacity = (size_type)pJVar45;
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,(anonymous_namespace)::JBT<std::__cxx11::string>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)((anonymous_namespace)::JBT<std::__cxx11::string>const&,(anonymous_namespace)::JBT<std::__cxx11::string>const&)>>
                      ((__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )uVar36,(__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 )uVar18,pJVar45,VVar54.int_,
                       (_Iter_comp_iter<bool_(*)(const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                        )0x47ff76);
            goto LAB_00478f6f;
          }
LAB_00478e2b:
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)((anonymous_namespace)::JBT<std::__cxx11::string>const&,(anonymous_namespace)::JBT<std::__cxx11::string>const&)>>
                    ((__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      )uVar36,(__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               )uVar18,
                     (_Iter_comp_iter<bool_(*)(const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                      )0x47ff76);
LAB_00478f6f:
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_290);
          uVar36 = local_150._8_8_;
          pJVar60 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_150._0_8_;
          pJVar45 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_150._8_8_;
          if (local_150._0_8_ != local_150._8_8_) {
            do {
              l = pJVar60;
              pJVar60 = l + 1;
              pJVar45 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_150._8_8_;
              if (pJVar60 ==
                  (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)uVar36) goto LAB_0047902c;
              bVar20 = JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::ValueEq(l,pJVar60);
            } while (!bVar20);
            pJVar45 = l + 2;
            pJVar60 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)uVar36;
            for (; pJVar45 !=
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)uVar36; pJVar45 = pJVar45 + 1) {
              bVar20 = JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::ValueEq(l,pJVar45);
              pJVar60 = l;
              if (!bVar20) {
                pJVar60 = l + 1;
                std::__cxx11::string::operator=((string *)pJVar60,(string *)pJVar45);
                l[1].Backtrace.Index = (pJVar45->Backtrace).Index;
              }
              l = pJVar60;
              pJVar60 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_150._8_8_;
            }
            pJVar45 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_150._8_8_;
            if (l + 1 != pJVar60) {
              paVar50 = &l[1].Value.field_2;
              do {
                if (paVar50 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*(long **)(paVar50->_M_local_buf + -0x10)) {
                  operator_delete(*(long **)(paVar50->_M_local_buf + -0x10),
                                  paVar50->_M_allocated_capacity + 1);
                }
                pJVar64 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(paVar50->_M_local_buf + 0x18);
                paVar50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar50->_M_local_buf + 0x28);
                pJVar45 = l + 1;
              } while (pJVar64 != pJVar60);
            }
          }
        }
      }
LAB_0047902c:
      local_150._8_8_ = pJVar45;
      Json::Value::Value((Value *)&local_208,objectValue);
      psVar24 = extraout_RDX_03;
      if (local_1d8 != (ValueHolder)0x0) {
        Json::Value::Value((Value *)&local_290,(String *)&local_1e0);
        pVVar25 = Json::Value::operator[]((Value *)&local_208,"language");
        Json::Value::operator=(pVVar25,(Value *)&local_290);
        Json::Value::~Value((Value *)&local_290);
        psVar24 = extraout_RDX_04;
      }
      paVar50 = local_108;
      if ((string *)local_1c0._8_8_ != (string *)0x0) {
        DumpSysroot((Value *)&local_290,(Target *)local_1c0,psVar24);
        pVVar25 = Json::Value::operator[]((Value *)&local_208,"sysroot");
        Json::Value::operator=(pVVar25,(Value *)&local_290);
        Json::Value::~Value((Value *)&local_290);
      }
      if (vStack_168.
          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          vStack_168.
          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        Json::Value::Value((Value *)&local_238,arrayValue);
        pJVar56 = vStack_168.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (this_04 = (Target *)
                       vStack_168.
                       super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_04 != (Target *)pJVar56;
            this_04 = (Target *)((this_04->TopSource).field_2._M_local_buf + 8)) {
          local_258.int_ = 0;
          local_250._M_local_buf[0] = '\0';
          local_260.string_ = (char *)&local_250;
          DumpCommandFragment((Value *)&local_290,this_04,
                              (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_260,(string *)VVar54.map_);
          Json::Value::append((Value *)&local_238,(Value *)&local_290);
          Json::Value::~Value((Value *)&local_290);
          if (local_260 != &local_250) {
            operator_delete(local_260.string_,
                            CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]
                                    ) + 1);
          }
        }
        pVVar25 = Json::Value::operator[]((Value *)&local_208,"compileCommandFragments");
        Json::Value::operator=(pVVar25,(Value *)&local_238);
        Json::Value::~Value((Value *)&local_238);
      }
      if (local_120 != cStack_118._M_current) {
        Json::Value::Value((Value *)&local_238,arrayValue);
        cVar19._M_current = cStack_118._M_current;
        for (pIVar37 = local_120; pIVar37 != cVar19._M_current; pIVar37 = pIVar37 + 1) {
          Json::Value::Value((Value *)&local_260,objectValue);
          Json::Value::Value((Value *)&local_290,(String *)pIVar37);
          pVVar25 = Json::Value::operator[]((Value *)&local_260,"path");
          Json::Value::operator=(pVVar25,(Value *)&local_290);
          Json::Value::~Value((Value *)&local_290);
          JVar23.Index = extraout_EDX;
          if (pIVar37->IsSystem == true) {
            Json::Value::Value((Value *)&local_290,true);
            pVVar25 = Json::Value::operator[]((Value *)&local_260,"isSystem");
            Json::Value::operator=(pVVar25,(Value *)&local_290);
            Json::Value::~Value((Value *)&local_290);
            JVar23.Index = extraout_EDX_00;
          }
          AddBacktrace((Target *)&local_260,(Value *)(ulong)(pIVar37->Path).Backtrace.Index,JVar23);
          Json::Value::append((Value *)&local_238,(Value *)&local_260);
          Json::Value::~Value((Value *)&local_260);
        }
        pVVar25 = Json::Value::operator[]((Value *)&local_208,"includes");
        Json::Value::operator=(pVVar25,(Value *)&local_238);
        Json::Value::~Value((Value *)&local_238);
      }
      if (local_150._0_8_ != local_150._8_8_) {
        Json::Value::Value((Value *)&local_238,arrayValue);
        uVar36 = local_150._8_8_;
        for (pJVar45 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_150._0_8_;
            pJVar45 !=
            (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
            )uVar36; pJVar45 = pJVar45 + 1) {
          Json::Value::Value((Value *)&local_260,objectValue);
          Json::Value::Value((Value *)&local_290,&pJVar45->Value);
          pVVar25 = Json::Value::operator[]((Value *)&local_260,"define");
          Json::Value::operator=(pVVar25,(Value *)&local_290);
          Json::Value::~Value((Value *)&local_290);
          AddBacktrace((Target *)&local_260,(Value *)(ulong)(pJVar45->Backtrace).Index,bt);
          Json::Value::append((Value *)&local_238,(Value *)&local_260);
          Json::Value::~Value((Value *)&local_260);
        }
        pVVar25 = Json::Value::operator[]((Value *)&local_208,"defines");
        Json::Value::operator=(pVVar25,(Value *)&local_238);
        Json::Value::~Value((Value *)&local_238);
      }
      if (pJStack_138 != local_130) {
        Json::Value::Value((Value *)&local_238,arrayValue);
        pJVar56 = local_130;
        for (pJVar65 = pJStack_138; pJVar65 != pJVar56; pJVar65 = pJVar65 + 1) {
          Json::Value::Value((Value *)&local_260,objectValue);
          Json::Value::Value((Value *)&local_290,&pJVar65->Value);
          pVVar25 = Json::Value::operator[]((Value *)&local_260,"header");
          Json::Value::operator=(pVVar25,(Value *)&local_290);
          Json::Value::~Value((Value *)&local_290);
          AddBacktrace((Target *)&local_260,(Value *)(ulong)(pJVar65->Backtrace).Index,bt_00);
          Json::Value::append((Value *)&local_238,(Value *)&local_260);
          Json::Value::~Value((Value *)&local_260);
        }
        pVVar25 = Json::Value::operator[]((Value *)&local_208,"precompileHeaders");
        Json::Value::operator=(pVVar25,(Value *)&local_238);
        Json::Value::~Value((Value *)&local_238);
      }
      if (local_1a0._8_8_ != 0) {
        Json::Value::Value((Value *)&local_260,objectValue);
        Json::Value::Value((Value *)&local_290,(String *)&local_1a0);
        pVVar25 = Json::Value::operator[]((Value *)&local_260,"standard");
        Json::Value::operator=(pVVar25,(Value *)&local_290);
        Json::Value::~Value((Value *)&local_290);
        if (local_180._M_allocated_capacity != local_180._8_8_) {
          Json::Value::Value((Value *)&local_290,arrayValue);
          uVar18 = local_180._8_8_;
          for (uVar36 = local_180._M_allocated_capacity; uVar36 != uVar18; uVar36 = uVar36 + 4) {
            Json::Value::Value((Value *)&local_238,((pointer)uVar36)->Index);
            Json::Value::append((Value *)&local_290,(Value *)&local_238);
            Json::Value::~Value((Value *)&local_238);
          }
          pVVar25 = Json::Value::operator[]((Value *)&local_260,"backtraces");
          Json::Value::operator=(pVVar25,(Value *)&local_290);
          Json::Value::~Value((Value *)&local_290);
        }
        pVVar25 = Json::Value::operator[]((Value *)&local_208,"languageStandard");
        Json::Value::operator=(pVVar25,(Value *)&local_260);
        Json::Value::~Value((Value *)&local_260);
      }
      CompileData::~CompileData((CompileData *)&local_1e0);
      pVVar25 = Json::Value::operator[]((Value *)&local_208,"sourceIndexes");
      Json::Value::operator=(pVVar25,(Value *)((long)paVar50 + 8));
      Json::Value::append(&local_80,(Value *)&local_208);
      Json::Value::~Value((Value *)&local_208);
      paVar50 = paVar50 + 3;
    } while (paVar50 != local_90);
  }
  bVar20 = Json::Value::empty(&local_80);
  if (!bVar20) {
    pVVar25 = Json::Value::operator[](__return_storage_ptr__,"compileGroups");
    Json::Value::operator=(pVVar25,&local_80);
  }
  Json::Value::~Value(&local_80);
  Json::Value::~Value(&local_58);
  Json::Value::~Value((Value *)&local_c8);
  BacktraceData::Dump((Value *)&local_1e0,&this->Backtraces);
  pVVar25 = Json::Value::operator[](__return_storage_ptr__,"backtraceGraph");
  Json::Value::operator=(pVVar25,(Value *)&local_1e0);
  Json::Value::~Value((Value *)&local_1e0);
  Json::Value::~Value((Value *)&local_f0);
  return extraout_RAX;
code_r0x00478e1a:
  paVar50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&(VVar54.map_)->_M_t;
  bVar20 = VVar54.uint_ <
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x2;
  VVar54 = VVar61;
  VVar51.string_ = paVar50->_M_local_buf + 1 >> 1;
  if (bVar20) goto LAB_00478e2b;
  goto LAB_00478e01;
}

Assistant:

Json::Value Target::Dump()
{
  Json::Value target = Json::objectValue;

  cmStateEnums::TargetType const type = this->GT->GetType();

  target["name"] = this->GT->GetName();
  target["type"] = cmState::GetTargetTypeName(type);
  target["id"] = TargetId(this->GT, this->TopBuild);
  target["paths"] = this->DumpPaths();
  if (this->GT->Target->GetIsGeneratorProvided()) {
    target["isGeneratorProvided"] = true;
  }

  this->AddBacktrace(target, this->GT->GetBacktrace());

  if (this->GT->Target->GetHaveInstallRule()) {
    target["install"] = this->DumpInstall();
  }

  if (this->GT->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = this->DumpArtifacts();
    if (!artifacts.empty()) {
      target["artifacts"] = std::move(artifacts);
    }
  }

  if (type == cmStateEnums::EXECUTABLE ||
      type == cmStateEnums::SHARED_LIBRARY ||
      type == cmStateEnums::MODULE_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["link"] = this->DumpLink();
  } else if (type == cmStateEnums::STATIC_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["archive"] = this->DumpArchive();
  }

  Json::Value dependencies = this->DumpDependencies();
  if (!dependencies.empty()) {
    target["dependencies"] = dependencies;
  }

  {
    this->ProcessLanguages();

    target["sources"] = this->DumpSources();

    Json::Value folder = this->DumpFolder();
    if (!folder.isNull()) {
      target["folder"] = std::move(folder);
    }

    Json::Value sourceGroups = this->DumpSourceGroups();
    if (!sourceGroups.empty()) {
      target["sourceGroups"] = std::move(sourceGroups);
    }

    Json::Value compileGroups = this->DumpCompileGroups();
    if (!compileGroups.empty()) {
      target["compileGroups"] = std::move(compileGroups);
    }
  }

  target["backtraceGraph"] = this->Backtraces.Dump();

  return target;
}